

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall Measurement_powroot_Test::TestBody(Measurement_powroot_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double in_XMM1_Qa;
  string local_598;
  AssertHelper local_578;
  Message local_570;
  measurement local_568;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_520;
  Message local_518;
  measurement local_510;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_4c8;
  Message local_4c0;
  measurement local_4b8;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_470;
  Message local_468;
  measurement local_460;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_418;
  Message local_410;
  measurement local_408;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3c0;
  Message local_3b8;
  measurement local_3b0;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_368;
  Message local_360;
  measurement local_358;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_310;
  Message local_308;
  measurement local_300;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_2b8;
  Message local_2b0;
  measurement local_2a8;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_260;
  Message local_258;
  measurement local_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_208;
  Message local_200;
  measurement local_1f8;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_1c8 [8];
  measurement mneg;
  Message local_1b0;
  measurement local_1a8;
  measurement local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_170 [8];
  measurement m4;
  Message local_158;
  unit local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  double local_128;
  double local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  measurement m0;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  measurement m2;
  Message local_98;
  unit local_90;
  unit local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  double local_50;
  double local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  measurement v1;
  measurement m1;
  Measurement_powroot_Test *this_local;
  
  units::measurement::measurement((measurement *)&v1.units_,2.0,(unit *)&units::m);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )units::pow(__x,in_XMM1_Qa);
  local_48 = units::measurement::value((measurement *)&gtest_ar.message_);
  local_50 = 8.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_40,"v1.value()","8.0",&local_48,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_88 = units::measurement::units((measurement *)&gtest_ar.message_);
  units::unit::pow((unit *)&units::m,__x_00,in_XMM1_Qa);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_80,"v1.units()","m.pow(3)",&local_88,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.units_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.units_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  join_0x00000000_0x00001200_ = units::root((measurement *)&gtest_ar.message_,3);
  local_c1 = units::measurement::operator==
                       ((measurement *)&gtest_ar_.message_,(measurement *)&v1.units_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&m0.units_,(internal *)local_c0,(AssertionResult *)"m2 == m1","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&m0.units_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  join_0x00000000_0x00001200_ = units::root((measurement *)&gtest_ar.message_,0);
  local_120 = units::measurement::value((measurement *)&gtest_ar_2.message_);
  local_128 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_118,"m0.value()","1.0",&local_120,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = units::measurement::units((measurement *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_148,"m0.units()","one",&local_150,(unit *)&units::one);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.units_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.units_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  units::unit::pow((unit *)&units::m,__x_01,in_XMM1_Qa);
  units::measurement::measurement((measurement *)local_170,16.0,(unit *)&gtest_ar_4.message_);
  local_198.value_ = units::sqrt(__x_02);
  units::measurement::measurement(&local_1a8,4.0,(unit *)&units::m);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_188,"sqrt(m4)","measurement(4.0, m)",&local_198,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mneg.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mneg.units_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mneg.units_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  units::unit::pow((unit *)&units::m,__x_03,in_XMM1_Qa);
  units::measurement::measurement((measurement *)local_1c8,-0.25,(unit *)&gtest_ar__1.message_);
  local_1f8 = units::root((measurement *)local_1c8,2);
  local_1e1 = units::is_valid(&local_1f8);
  local_1e1 = !local_1e1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1e0,
               (AssertionResult *)"is_valid(root(mneg, 2))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_250 = units::root((measurement *)local_1c8,-2);
  local_239 = units::is_valid(&local_250);
  local_239 = !local_239;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_238,
               (AssertionResult *)"is_valid(root(mneg, -2))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_2a8 = units::root((measurement *)local_1c8,4);
  local_291 = units::is_valid(&local_2a8);
  local_291 = !local_291;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_290,
               (AssertionResult *)"is_valid(root(mneg, 4))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_300 = units::root((measurement *)local_1c8,-4);
  local_2e9 = units::is_valid(&local_300);
  local_2e9 = !local_2e9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_2e8,
               (AssertionResult *)"is_valid(root(mneg, -4))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_358 = units::root((measurement *)local_1c8,6);
  local_341 = units::is_valid(&local_358);
  local_341 = !local_341;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_340,
               (AssertionResult *)"is_valid(root(mneg, 6))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_3b0 = units::root((measurement *)local_1c8,-6);
  local_399 = units::is_valid(&local_3b0);
  local_399 = !local_399;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_398,&local_399,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_398,
               (AssertionResult *)"is_valid(root(mneg, -6))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_408 = units::root((measurement *)local_1c8,0);
  local_3f1 = units::is_valid(&local_408);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_3f0,
               (AssertionResult *)"is_valid(root(mneg, 0))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_460 = units::root((measurement *)local_1c8,1);
  local_449 = units::is_valid(&local_460);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_448,
               (AssertionResult *)"is_valid(root(mneg, 1))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_4b8 = units::root((measurement *)local_1c8,-1);
  local_4a1 = units::is_valid(&local_4b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_4a0,
               (AssertionResult *)"is_valid(root(mneg, -1))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  local_510 = units::root((measurement *)local_1c8,3);
  local_4f9 = units::is_valid(&local_510);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_4f8,
               (AssertionResult *)"is_valid(root(mneg, 3))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_568 = units::root((measurement *)local_1c8,-3);
  local_551 = units::is_valid(&local_568);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_550,&local_551,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_598,(internal *)local_550,(AssertionResult *)"is_valid(root(mneg, -3))",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  return;
}

Assistant:

TEST(Measurement, powroot)
{
    measurement m1(2.0, m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    auto m0 = root(v1, 0);
    EXPECT_EQ(m0.value(), 1.0);
    EXPECT_EQ(m0.units(), one);

    measurement m4(16.0, m.pow(2));
    EXPECT_EQ(sqrt(m4), measurement(4.0, m));

    measurement mneg(-0.25, m.pow(6));
    EXPECT_FALSE(is_valid(root(mneg, 2)));
    EXPECT_FALSE(is_valid(root(mneg, -2)));
    EXPECT_FALSE(is_valid(root(mneg, 4)));
    EXPECT_FALSE(is_valid(root(mneg, -4)));
    EXPECT_FALSE(is_valid(root(mneg, 6)));
    EXPECT_FALSE(is_valid(root(mneg, -6)));
    EXPECT_TRUE(is_valid(root(mneg, 0)));
    EXPECT_TRUE(is_valid(root(mneg, 1)));
    EXPECT_TRUE(is_valid(root(mneg, -1)));
    EXPECT_TRUE(is_valid(root(mneg, 3)));
    EXPECT_TRUE(is_valid(root(mneg, -3)));
#endif
}